

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O2

DependencyInfo * __thiscall
helics::TimeDependencies::getDependencyInfo(TimeDependencies *this,GlobalFederateId gid)

{
  DependencyInfo *pDVar1;
  __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  _Var2;
  __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  _Var3;
  
  pDVar1 = (this->dependencies).
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  _Var2 = std::
          lower_bound<__gnu_cxx::__normal_iterator<helics::DependencyInfo*,std::vector<helics::DependencyInfo,std::allocator<helics::DependencyInfo>>>,helics::GlobalFederateId,helics::__0>
                    ((this->dependencies).
                     super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start,pDVar1);
  if (_Var2._M_current == pDVar1) {
    _Var3._M_current = (DependencyInfo *)0x0;
  }
  else {
    _Var3._M_current = (DependencyInfo *)0x0;
    if (((_Var2._M_current)->fedID).gid == gid.gid) {
      _Var3 = _Var2;
    }
  }
  return _Var3._M_current;
}

Assistant:

DependencyInfo* TimeDependencies::getDependencyInfo(GlobalFederateId gid)
{
    auto res = std::lower_bound(dependencies.begin(), dependencies.end(), gid, dependencyCompare);
    if ((res == dependencies.end()) || (res->fedID != gid)) {
        return nullptr;
    }

    return &(*res);
}